

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.cpp
# Opt level: O0

ssize_t readline::read(int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar3;
  undefined4 in_register_0000003c;
  bool eof;
  string *history_path_local;
  string *prompt_local;
  string *input_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  linenoise::LoadHistory(pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  bVar2 = linenoise::Readline(pcVar1,(string *)CONCAT44(in_register_0000003c,__fd));
  uVar3 = extraout_var;
  if (!bVar2) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    linenoise::AddHistory(pcVar1);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    linenoise::SaveHistory(pcVar1);
    uVar3 = extraout_var_00;
  }
  return CONCAT71(uVar3,!bVar2);
}

Assistant:

bool read(std::string& input, const std::string& prompt,
          const std::string& history_path)
{
    linenoise::LoadHistory(history_path.c_str());

    const auto eof = linenoise::Readline(prompt.c_str(), input);

    if (eof)
        return false;

    linenoise::AddHistory(input.c_str());
    linenoise::SaveHistory(history_path.c_str());

    return true;
}